

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O0

void __thiscall duckdb::BuiltinFunctions::RegisterExtensionOverloads(BuiltinFunctions *this)

{
  string *psVar1;
  bool bVar2;
  Value *this_00;
  reference val;
  undefined8 uVar3;
  ulong uVar4;
  string *in_stack_000002b8;
  ScalarFunction function;
  Value *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<duckdb::Value,_true> *__range2;
  Value parameters;
  LogicalType return_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  vector<duckdb::LogicalType,_true> arguments;
  ExtensionFunctionOverloadEntry *entry;
  ExtensionFunctionOverloadEntry *__end1;
  ExtensionFunctionOverloadEntry *__begin1;
  ExtensionFunctionOverloadEntry (*__range1) [204];
  ScalarFunctionSet current_set;
  ScalarFunction *in_stack_fffffffffffff938;
  ScalarFunction *in_stack_fffffffffffff940;
  shared_ptr<duckdb::ExtensionFunctionInfo,_true> *other;
  shared_ptr<duckdb::ScalarFunctionInfo,_true> *this_01;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  char (*args) [48];
  char *in_stack_fffffffffffff970;
  string *in_stack_fffffffffffff978;
  Value *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  allocator *in_stack_fffffffffffff998;
  undefined1 strict;
  string *in_stack_fffffffffffff9a0;
  Value *in_stack_fffffffffffff9a8;
  allocator *paVar6;
  bind_scalar_function_t in_stack_fffffffffffffa18;
  scalar_function_t *in_stack_fffffffffffffa20;
  LogicalType *in_stack_fffffffffffffa28;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa38;
  ScalarFunction *in_stack_fffffffffffffa40;
  bind_scalar_function_extended_t in_stack_fffffffffffffa50;
  function_statistics_t in_stack_fffffffffffffa58;
  init_local_state_t in_stack_fffffffffffffa60;
  LogicalType *in_stack_fffffffffffffa68;
  FunctionStability in_stack_fffffffffffffa70;
  FunctionNullHandling in_stack_fffffffffffffa78;
  bind_lambda_function_t in_stack_fffffffffffffa80;
  Value local_4b1;
  ScalarFunctionSet *in_stack_fffffffffffffba8;
  BuiltinFunctions *in_stack_fffffffffffffbb0;
  shared_ptr<duckdb::ScalarFunctionInfo,_true> local_410 [6];
  allocator local_3a1;
  string local_3a0 [334];
  undefined1 local_252;
  allocator local_251;
  string local_250 [32];
  string local_230 [56];
  reference local_1f8;
  Value *local_1f0;
  __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
  local_1e8;
  vector<duckdb::Value,_true> *local_1e0;
  string local_1a8 [191];
  allocator local_e9;
  string local_e8 [55];
  allocator local_b1;
  string local_b0 [80];
  string *local_60;
  string *local_58;
  string *local_50;
  undefined1 *local_48;
  
  ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)in_stack_fffffffffffff980);
  local_48 = EXTENSION_FUNCTION_OVERLOADS;
  local_50 = (string *)EXTENSION_FUNCTION_OVERLOADS;
  local_58 = (string *)0x51cb98c;
  while( true ) {
    strict = (undefined1)((ulong)in_stack_fffffffffffff998 >> 0x38);
    if (local_50 == local_58) {
      ScalarFunctionSet::ScalarFunctionSet
                ((ScalarFunctionSet *)in_stack_fffffffffffff940,
                 (ScalarFunctionSet *)in_stack_fffffffffffff938);
      AddExtensionFunction(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0x2a4ef27);
      ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0x2a4ef34);
      return;
    }
    local_60 = local_50;
    vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x2a4e4d2);
    psVar1 = local_60 + 3;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b0,&psVar1->field_0x1,&local_b1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,">",&local_e9);
    StringUtil::Split((string *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    ::std::__cxx11::string::~string(local_e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    ::std::__cxx11::string::~string(local_b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    this_00 = (Value *)vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)in_stack_fffffffffffff940,
                                    (size_type)in_stack_fffffffffffff938);
    DBConfig::ParseLogicalType(in_stack_000002b8);
    val = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)in_stack_fffffffffffff940,(size_type)in_stack_fffffffffffff938);
    ::std::__cxx11::string::string(local_1a8,(string *)val);
    Value::Value(this_00,val);
    LogicalType::LogicalType
              ((LogicalType *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               (LogicalTypeId)((uint)in_stack_fffffffffffff95c >> 0x18));
    LogicalType::LIST((LogicalType *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    Value::DefaultCastAs
              (in_stack_fffffffffffff9a8,(LogicalType *)in_stack_fffffffffffff9a0,(bool)strict);
    LogicalType::~LogicalType((LogicalType *)0x2a4e675);
    LogicalType::~LogicalType((LogicalType *)0x2a4e682);
    Value::~Value((Value *)in_stack_fffffffffffff940);
    ::std::__cxx11::string::~string(local_1a8);
    local_1e0 = ListValue::GetChildren(in_stack_fffffffffffff980);
    local_1e8._M_current =
         (Value *)::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::begin
                            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                             in_stack_fffffffffffff938);
    local_1f0 = (Value *)::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::end
                                   ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                                    in_stack_fffffffffffff938);
    while (bVar2 = __gnu_cxx::
                   operator!=<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                             ((__normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                               *)in_stack_fffffffffffff940,
                              (__normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                               *)in_stack_fffffffffffff938), psVar1 = local_60, bVar2) {
      local_1f8 = __gnu_cxx::
                  __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                  ::operator*(&local_1e8);
      Value::
      GetValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ((Value *)in_stack_fffffffffffff938);
      DBConfig::ParseLogicalType(in_stack_000002b8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
      LogicalType::~LogicalType((LogicalType *)0x2a4e76c);
      ::std::__cxx11::string::~string(local_230);
      __gnu_cxx::
      __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
      ::operator++(&local_1e8);
    }
    if (local_60[3]._M_dataplus != (_Alloc_hider)0x1a) break;
    in_stack_fffffffffffff998 = &local_3a1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_3a0,(char *)psVar1,in_stack_fffffffffffff998);
    vector<duckdb::LogicalType,_true>::vector
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff940,
               (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff938);
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffff940,(LogicalType *)in_stack_fffffffffffff938);
    in_stack_fffffffffffff98c = 0;
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    LogicalType::LogicalType
              ((LogicalType *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               (LogicalTypeId)((uint)in_stack_fffffffffffff95c >> 0x18));
    this_01 = local_410;
    args = (char (*) [48])0x0;
    in_stack_fffffffffffff960 = 0;
    uVar5 = 0;
    other = (shared_ptr<duckdb::ExtensionFunctionInfo,_true> *)0x0;
    in_stack_fffffffffffff940 = (ScalarFunction *)0x0;
    in_stack_fffffffffffff938 = (ScalarFunction *)0x0;
    ScalarFunction::ScalarFunction
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffa58,in_stack_fffffffffffffa60,
               in_stack_fffffffffffffa68,in_stack_fffffffffffffa70,in_stack_fffffffffffffa78,
               in_stack_fffffffffffffa80);
    LogicalType::~LogicalType((LogicalType *)0x2a4eb26);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x2a4eb33);
    LogicalType::~LogicalType((LogicalType *)0x2a4eb40);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2a4eb4d);
    ::std::__cxx11::string::~string(local_3a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    make_shared_ptr<duckdb::ExtensionFunctionInfo,_const_char_(&)[48]>(args);
    shared_ptr<duckdb::ScalarFunctionInfo,_true>::operator=<duckdb::ExtensionFunctionInfo,_0>
              (this_01,other);
    shared_ptr<duckdb::ExtensionFunctionInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtensionFunctionInfo,_true> *)0x2a4eba6);
    bVar2 = ::std::operator!=<char,_std::char_traits<char>,_std::allocator<char>_>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
    in_stack_fffffffffffff988 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff988);
    if (bVar2) {
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ScalarFunctionSet::ScalarFunctionSet
                  ((ScalarFunctionSet *)in_stack_fffffffffffff940,
                   (ScalarFunctionSet *)in_stack_fffffffffffff938);
        AddExtensionFunction(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0x2a4ec1e);
      }
      in_stack_fffffffffffff980 = &local_4b1;
      in_stack_fffffffffffff978 = local_60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_4b1.type_.physical_type_,(char *)in_stack_fffffffffffff978,
                 (allocator *)in_stack_fffffffffffff980);
      ScalarFunctionSet::ScalarFunctionSet
                ((ScalarFunctionSet *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      ScalarFunctionSet::operator=
                ((ScalarFunctionSet *)in_stack_fffffffffffff940,
                 (ScalarFunctionSet *)in_stack_fffffffffffff938);
      ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0x2a4ed8c);
      ::std::__cxx11::string::~string((string *)&local_4b1.type_.physical_type_);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    }
    ScalarFunction::ScalarFunction
              ((ScalarFunction *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               (ScalarFunction *)CONCAT44(in_stack_fffffffffffff95c,uVar5));
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)in_stack_fffffffffffff940,
               in_stack_fffffffffffff938);
    ScalarFunction::~ScalarFunction(in_stack_fffffffffffff940);
    ScalarFunction::~ScalarFunction(in_stack_fffffffffffff940);
    Value::~Value((Value *)in_stack_fffffffffffff940);
    LogicalType::~LogicalType((LogicalType *)0x2a4ee53);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x2a4ee60);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2a4ee6d);
    local_50 = (string *)&local_50[6].field_0x1;
  }
  local_252 = 1;
  uVar3 = __cxa_allocate_exception(0x10);
  paVar6 = &local_251;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_250,
             "Extension function overloads only supported for scalar functions currently - %s has a different type"
             ,paVar6);
  InternalException::InternalException<const_char_*>
            ((InternalException *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             in_stack_fffffffffffff970);
  local_252 = 0;
  __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void BuiltinFunctions::RegisterExtensionOverloads() {
#ifdef GENERATE_EXTENSION_ENTRIES
	// do not insert auto loading placeholders when generating extension entries
	return;
#endif
	ScalarFunctionSet current_set;
	for (auto &entry : EXTENSION_FUNCTION_OVERLOADS) {
		vector<LogicalType> arguments;
		auto splits = StringUtil::Split(entry.signature, ">");
		auto return_type = DBConfig::ParseLogicalType(splits[1]);
		auto parameters = Value(splits[0]).DefaultCastAs(LogicalType::LIST(LogicalType::VARCHAR));
		for (auto &param : ListValue::GetChildren(parameters)) {
			arguments.push_back(DBConfig::ParseLogicalType(param.GetValue<string>()));
		}
		if (entry.type != CatalogType::SCALAR_FUNCTION_ENTRY) {
			throw InternalException(
			    "Extension function overloads only supported for scalar functions currently - %s has a different type",
			    entry.name);
		}

		ScalarFunction function(entry.name, std::move(arguments), std::move(return_type), nullptr,
		                        BindExtensionFunction);
		function.function_info = make_shared_ptr<ExtensionFunctionInfo>(entry.extension);
		if (current_set.name != entry.name) {
			if (!current_set.name.empty()) {
				// create set of functions
				AddExtensionFunction(current_set);
			}
			current_set = ScalarFunctionSet(entry.name);
		}
		// add this function to the set of function overloads
		current_set.AddFunction(std::move(function));
	}
	AddExtensionFunction(std::move(current_set));
}